

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_>::moveAppend
          (QGenericArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_> *this,
          pair<QModelIndex,_QPersistentModelIndex> *b,pair<QModelIndex,_QPersistentModelIndex> *e)

{
  qsizetype *pqVar1;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar2;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar3;
  long lVar4;
  QPersistentModelIndexData *pQVar5;
  quintptr qVar6;
  int iVar7;
  
  if (b != e) {
    ppVar3 = (this->super_QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>).ptr;
    for (; b < e; b = b + 1) {
      lVar4 = (this->super_QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>).size;
      ppVar3[lVar4].first.m.ptr = (b->first).m.ptr;
      iVar7 = (b->first).c;
      qVar6 = (b->first).i;
      ppVar2 = ppVar3 + lVar4;
      (ppVar2->first).r = (b->first).r;
      (ppVar2->first).c = iVar7;
      (ppVar2->first).i = qVar6;
      pQVar5 = (b->second).d;
      (b->second).d = (QPersistentModelIndexData *)0x0;
      ppVar3[lVar4].second.d = pQVar5;
      pqVar1 = &(this->super_QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>).size
      ;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }